

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O1

bool __thiscall CSocekt::flyd_open_listening_sockets(CSocekt *this)

{
  pointer *pppfVar1;
  char *pcVar2;
  iterator __position;
  bool bVar3;
  int __fd;
  int iVar4;
  int iVar5;
  Config *this_00;
  LogStream *pLVar6;
  char **ppcVar7;
  int iVar8;
  int v;
  ulong uVar9;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  int reuseaddr;
  lp_listening_t p_listensocketitem;
  sockaddr_in serv_addr;
  char strinfo [100];
  undefined4 local_10a4;
  flyd_listening_s *local_10a0;
  sockaddr local_1098;
  vector<flyd_listening_s*,std::allocator<flyd_listening_s*>> *local_1080;
  char local_1078 [112];
  Logger local_1008;
  
  local_1098.sa_data[6] = '\0';
  local_1098.sa_data[7] = '\0';
  local_1098.sa_data[8] = '\0';
  local_1098.sa_data[9] = '\0';
  local_1098.sa_data[10] = '\0';
  local_1098.sa_data[0xb] = '\0';
  local_1098.sa_data[0xc] = '\0';
  local_1098.sa_data[0xd] = '\0';
  local_1098.sa_family = 2;
  local_1098.sa_data[0] = '\0';
  local_1098.sa_data[1] = '\0';
  local_1098.sa_data[2] = '\0';
  local_1098.sa_data[3] = '\0';
  local_1098.sa_data[4] = '\0';
  local_1098.sa_data[5] = '\0';
  if (0 < this->m_ListenPortCount) {
    iVar8 = (int)&local_1008 + 0xfb8;
    local_1080 = (vector<flyd_listening_s*,std::allocator<flyd_listening_s*>> *)
                 &this->m_ListenSocketList;
    uVar9 = 0;
    do {
      __fd = socket(2,1,0);
      v = (int)uVar9;
      if (__fd == -1) {
        file_02._8_8_ = 0xe;
        file_02.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&local_1008,file_02,0xd6,ERROR);
        if (0x2a < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_))
        {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,
                          "CSocekt::Initialize()中socket()失败,i= ",0x2a);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0x2a;
        }
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,v);
        goto LAB_00112b39;
      }
      local_10a4 = 1;
      iVar4 = setsockopt(__fd,1,2,&local_10a4,4);
      if (iVar4 == -1) {
        file_03._8_8_ = 0xe;
        file_03.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&local_1008,file_03,0xe3,ERROR);
        if (0x3a < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_))
        {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,
                          "CSocekt::Initialize()中setsockopt(SO_REUSEADDR)失败,i= ",0x3a);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0x3a;
        }
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,v);
LAB_00112d23:
        muduo::Logger::~Logger(&local_1008);
        close(__fd);
        goto LAB_00112d37;
      }
      local_1008.impl_.time_.microSecondsSinceEpoch_._0_4_ = 1;
      iVar4 = ioctl(__fd,0x5421,&local_1008);
      if (iVar4 == -1) {
        file_04._8_8_ = 0xe;
        file_04.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&local_1008,file_04,0xeb,ERROR);
        if (0x32 < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_))
        {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,
                          "CSocekt::Initialize()中setnonblocking()失败,i= ",0x32);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0x32;
        }
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,v);
        goto LAB_00112d23;
      }
      local_1078[0] = '\0';
      sprintf(local_1078,"ListenPort%d",uVar9);
      this_00 = flyd::Singleton<flyd::Config>::getInstance();
      iVar4 = flyd::Config::GetIntDefault(this_00,local_1078,10000);
      if (muduo::g_logLevel < 2) {
        file._8_8_ = 0xe;
        file.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&local_1008,file,0xf5,DEBUG,"flyd_open_listening_sockets");
        if (8 < (uint)(iVar8 - (int)local_1008.impl_.stream_.buffer_.cur_)) {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"iport = ",8);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 8;
        }
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,iVar4);
        muduo::Logger::~Logger(&local_1008);
      }
      local_1098.sa_data._0_2_ = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
      iVar5 = bind(__fd,&local_1098,0x10);
      if (iVar5 == -1) {
        file_05._8_8_ = 0xe;
        file_05.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&local_1008,file_05,0xfd,ERROR);
        if (0x28 < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_))
        {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,
                          "CSocekt::Initialize()中bind()失败,i= ",0x28);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0x28;
        }
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,v);
        goto LAB_00112d23;
      }
      iVar5 = listen(__fd,0x1ff);
      if (iVar5 == -1) {
        file_06._8_8_ = 0xe;
        file_06.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&local_1008,file_06,0x106,ERROR);
        if (0x2a < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_))
        {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,
                          "CSocekt::Initialize()中listen()失败,i= ",0x2a);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0x2a;
        }
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,v);
        goto LAB_00112d23;
      }
      local_10a0 = (flyd_listening_s *)operator_new(0x10);
      local_10a0->port = 0;
      local_10a0->fd = 0;
      local_10a0->connection = (lp_connection_t)0x0;
      local_10a0->port = iVar4;
      local_10a0->fd = __fd;
      if (muduo::g_logLevel < 3) {
        file_00._8_8_ = 0xe;
        file_00.data_ = "flyd_socket.cc";
        muduo::Logger::Logger(&local_1008,file_00,0x111);
        if (6 < (uint)(iVar8 - (int)local_1008.impl_.stream_.buffer_.cur_)) {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"监听",6);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 6;
        }
        pLVar6 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,iVar4);
        ppcVar7 = &(pLVar6->buffer_).cur_;
        pcVar2 = (pLVar6->buffer_).cur_;
        if (0xd < (uint)((int)ppcVar7 - (int)pcVar2)) {
          builtin_strncpy(pcVar2,"端口成功!",0xd);
          *ppcVar7 = *ppcVar7 + 0xd;
        }
        muduo::Logger::~Logger(&local_1008);
      }
      __position._M_current =
           (this->m_ListenSocketList).
           super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_ListenSocketList).
          super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<flyd_listening_s*,std::allocator<flyd_listening_s*>>::
        _M_realloc_insert<flyd_listening_s*const&>(local_1080,__position,&local_10a0);
      }
      else {
        *__position._M_current = local_10a0;
        pppfVar1 = &(this->m_ListenSocketList).
                    super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppfVar1 = *pppfVar1 + 1;
      }
      uVar9 = (ulong)(v + 1U);
    } while ((int)(v + 1U) < this->m_ListenPortCount);
  }
  bVar3 = true;
  if ((this->m_ListenSocketList).
      super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->m_ListenSocketList).
      super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    file_01._8_8_ = 0xe;
    file_01.data_ = "flyd_socket.cc";
    muduo::Logger::Logger(&local_1008,file_01,0x116,ERROR);
    if (0x1b < (uint)(((int)&local_1008 + 0xfb8) - (int)local_1008.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"一个端口都没有监听",0x1b);
      local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 0x1b;
    }
LAB_00112b39:
    muduo::Logger::~Logger(&local_1008);
LAB_00112d37:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CSocekt::flyd_open_listening_sockets()
{
    int                isock;                //socket
    struct sockaddr_in serv_addr;            //服务器的地址结构体
    int                iport;                //端口
    char               strinfo[100];         //临时字符串

    //初始化相关
    memset(&serv_addr,0,sizeof(serv_addr));  //先初始化一下
    serv_addr.sin_family = AF_INET;                //选择协议族为IPV4
    serv_addr.sin_addr.s_addr = htonl(INADDR_ANY); //监听本地所有的IP地址；INADDR_ANY表示的是一个服务器上所有的网卡（服务器可能不止一个网卡）多个本地ip地址都进行绑定端口号，进行侦听。

    //中途用到一些配置信息
  //  CConfig *p_config = CConfig::GetInstance();
    for(int i = 0; i < m_ListenPortCount; i++) //要监听这么多个端口
    {
        //参数1：AF_INET：使用ipv4协议，一般就这么写
        //参数2：SOCK_STREAM：使用TCP，表示可靠连接【相对还有一个UDP套接字，表示不可靠连接】
        //参数3：给0，固定用法，就这么记
        isock = socket(AF_INET,SOCK_STREAM,0); //系统函数，成功返回非负描述符，出错返回-1
        if(isock == -1)
        {
            LOG_ERROR << "CSocekt::Initialize()中socket()失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中socket()失败,i=%d.",i);
            //其实这里直接退出，那如果以往有成功创建的socket呢？就没得到释放吧，当然走到这里表示程序不正常，应该整个退出，也没必要释放了
            return false;
        }

        //setsockopt（）:设置一些套接字参数选项；
        //参数2：是表示级别，和参数3配套使用，也就是说，参数3如果确定了，参数2就确定了;
        //参数3：允许重用本地地址
        //设置 SO_REUSEADDR，目的第五章第三节讲解的非常清楚：主要是解决TIME_WAIT这个状态导致bind()失败的问题
        int reuseaddr = 1;  //1:打开对应的设置项
        if(setsockopt(isock,SOL_SOCKET, SO_REUSEADDR,(const void *) &reuseaddr, sizeof(reuseaddr)) == -1)
        {
            LOG_ERROR << "CSocekt::Initialize()中setsockopt(SO_REUSEADDR)失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中setsockopt(SO_REUSEADDR)失败,i=%d.",i);
            close(isock); //无需理会是否正常执行了
            return false;
        }
        //设置该socket为非阻塞
        if(setnonblocking(isock) == false)
        {
            LOG_ERROR << "CSocekt::Initialize()中setnonblocking()失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中setnonblocking()失败,i=%d.",i);
            close(isock);
            return false;
        }

        //设置本服务器要监听的地址和端口，这样客户端才能连接到该地址和端口并发送数据
        strinfo[0] = 0;
        sprintf(strinfo,"ListenPort%d",i);
        iport = Singleton<Config>::getInstance().GetIntDefault(strinfo, 10000);
        LOG_DEBUG << "iport = " << iport;
       // iport = p_config->GetIntDefault(strinfo,10000);
        serv_addr.sin_port = htons((in_port_t)iport);   //in_port_t其实就是uint16_t

        //绑定服务器地址结构体
        if(bind(isock, (struct sockaddr*)&serv_addr, sizeof(serv_addr)) == -1)
        {
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中bind()失败,i=%d.",i);
            LOG_ERROR << "CSocekt::Initialize()中bind()失败,i= " << i ;
            close(isock);
            return false;
        }

        //开始监听
        if(listen(isock,FLYD_LISTEN_BACKLOG) == -1)
        {
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中listen()失败,i=%d.",i);
            LOG_ERROR << "CSocekt::Initialize()中listen()失败,i= " << i ;
            close(isock);
            return false;
        }

        //可以，放到列表里来
        lp_listening_t p_listensocketitem = new flyd_listening_t; //千万不要写错，注意前边类型是指针，后边类型是一个结构体
        memset(p_listensocketitem,0,sizeof(flyd_listening_t));      //注意后边用的是 ngx_listening_t而不是lpngx_listening_t
        p_listensocketitem->port = iport;                          //记录下所监听的端口号
        p_listensocketitem->fd   = isock;                          //套接字句柄保存下来
     //   ngx_log_error_core(NGX_LOG_INFO,0,"监听%d端口成功!",iport); //显示一些信息到日志中
        LOG_INFO << "监听" << iport << "端口成功!";
        m_ListenSocketList.push_back(p_listensocketitem);          //加入到队列中
    } //end for(int i = 0; i < m_ListenPortCount; i++)
    if(m_ListenSocketList.size() <= 0)  //不可能一个端口都不监听吧
    {
        LOG_ERROR << "一个端口都没有监听";
        return false;
    }
    return true;
}